

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O3

void helper_mtc0_tchalt_mips64(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  CPUMIPSState_conflict5 *__mptr;
  CPUState *cpu;
  
  cpu = (CPUState *)(env[-3].tcs[0xc].gpr + 0x12);
  (env->active_tc).CP0_TCHalt = arg1 & 1;
  if ((arg1 & 1) != 0) {
    *(undefined4 *)&env[-1].tcs[0xd].PC = 1;
    cpu_reset_interrupt(cpu,0x100);
    return;
  }
  if ((((((env->active_tc).CP0_TCStatus & 0x2000) != 0) && ((env->CP0_VPEConf0 & 1U) != 0)) &&
      ((env->mvp->CP0_MVPControl & 1U) != 0)) && ((int)env[-1].tcs[0xd].PC == 0)) {
    (*cpu_interrupt_handler)(cpu,0x100);
    return;
  }
  return;
}

Assistant:

void helper_mtc0_tchalt(CPUMIPSState *env, target_ulong arg1)
{
    MIPSCPU *cpu = env_archcpu(env);

    env->active_tc.CP0_TCHalt = arg1 & 0x1;

    /* TODO: Halt TC / Restart (if allocated+active) TC. */
    if (env->active_tc.CP0_TCHalt & 1) {
        mips_tc_sleep(cpu, env->current_tc);
    } else {
        mips_tc_wake(cpu, env->current_tc);
    }
}